

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

QPixmapStylePixmap * __thiscall
QHash<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap>::value
          (QHash<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap> *this,ControlPixmap *key)

{
  QPixmapStylePixmap *pQVar1;
  QPixmapStylePixmap *in_RDI;
  QPixmapStylePixmap *v;
  QPixmapStylePixmap *in_stack_ffffffffffffffc8;
  QPixmapStylePixmap *pQVar2;
  
  pQVar2 = in_RDI;
  pQVar1 = valueImpl<QPixmapStyle::ControlPixmap>
                     ((QHash<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap> *)in_RDI,
                      (ControlPixmap *)in_RDI);
  if (pQVar1 == (QPixmapStylePixmap *)0x0) {
    memset(in_RDI,0,0x28);
    QPixmapStylePixmap::QPixmapStylePixmap(in_RDI);
  }
  else {
    QPixmapStylePixmap::QPixmapStylePixmap(in_RDI,in_stack_ffffffffffffffc8);
  }
  return pQVar2;
}

Assistant:

T value(const Key &key) const noexcept
    {
        if (T *v = valueImpl(key))
            return *v;
        else
            return T();
    }